

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedBase.cpp
# Opt level: O0

bool __thiscall
glcts::DrawBuffersIndexedBase::BlendMaskStateMachine::CheckBuffer
          (BlendMaskStateMachine *this,int idx)

{
  GLboolean GVar1;
  uint uVar2;
  uint uVar3;
  GLint GVar4;
  GLuint GVar5;
  byte bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  reference pvVar14;
  MessageBuilder *pMVar15;
  MessageBuilder local_508;
  float local_388;
  float local_384;
  GLfloat fa [4];
  MessageBuilder local_370;
  GLboolean local_1ec;
  GLboolean local_1eb;
  GLboolean local_1ea;
  GLboolean local_1e9;
  uint uStack_1e8;
  GLboolean ba [4];
  GLint64 lia [4];
  GLint ia [4];
  bool local_1ad [7];
  bool result;
  MessageBuilder local_1a0;
  GLuint local_1c;
  BlendMaskStateMachine *pBStack_18;
  int idx_local;
  BlendMaskStateMachine *this_local;
  
  local_1c = idx;
  pBStack_18 = this;
  bVar6 = (*this->gl->isEnabledi)(0xbe2,idx);
  pvVar14 = std::
            vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
            ::operator[](&this->state,(long)(int)local_1c);
  GVar5 = local_1c;
  if ((uint)bVar6 == pvVar14->enable) {
    pvVar14 = std::
              vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
              ::operator[](&this->state,(long)(int)local_1c);
    bVar7 = CheckEnumForBuffer(this,GVar5,0x8009,pvVar14->mode_rgb);
    GVar5 = local_1c;
    pvVar14 = std::
              vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
              ::operator[](&this->state,(long)(int)local_1c);
    bVar8 = CheckEnumForBuffer(this,GVar5,0x883d,pvVar14->mode_a);
    GVar5 = local_1c;
    pvVar14 = std::
              vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
              ::operator[](&this->state,(long)(int)local_1c);
    bVar9 = CheckEnumForBuffer(this,GVar5,0x80c9,pvVar14->func_src_rgb);
    GVar5 = local_1c;
    pvVar14 = std::
              vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
              ::operator[](&this->state,(long)(int)local_1c);
    bVar10 = CheckEnumForBuffer(this,GVar5,0x80cb,pvVar14->func_src_a);
    GVar5 = local_1c;
    pvVar14 = std::
              vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
              ::operator[](&this->state,(long)(int)local_1c);
    bVar11 = CheckEnumForBuffer(this,GVar5,0x80c8,pvVar14->func_dst_rgb);
    GVar5 = local_1c;
    pvVar14 = std::
              vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
              ::operator[](&this->state,(long)(int)local_1c);
    bVar12 = CheckEnumForBuffer(this,GVar5,0x80ca,pvVar14->func_dst_a);
    bVar12 = ((((bVar7 && bVar8) && bVar9) && bVar10) && bVar11) && bVar12;
    (*this->gl->getIntegeri_v)(0xc23,local_1c,(GLint *)(lia + 3));
    (*this->gl->getInteger64i_v)(0xc23,local_1c,(GLint64 *)&uStack_1e8);
    (*this->gl->getBooleani_v)(0xc23,local_1c,&local_1ec);
    uVar3 = (uint)lia[3];
    pvVar14 = std::
              vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
              ::operator[](&this->state,(long)(int)local_1c);
    uVar2 = uStack_1e8;
    if ((((((uVar3 != pvVar14->mask_r) ||
           (pvVar14 = std::
                      vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                      ::operator[](&this->state,(long)(int)local_1c), GVar1 = local_1ec,
           uVar2 != pvVar14->mask_r)) ||
          (pvVar14 = std::
                     vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                     ::operator[](&this->state,(long)(int)local_1c), uVar2 = lia[3]._4_4_,
          GVar1 != pvVar14->mask_r)) ||
         ((pvVar14 = std::
                     vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                     ::operator[](&this->state,(long)(int)local_1c), uVar3 = (uint)lia[0],
          uVar2 != pvVar14->mask_g ||
          (pvVar14 = std::
                     vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                     ::operator[](&this->state,(long)(int)local_1c), GVar1 = local_1eb,
          uVar3 != pvVar14->mask_g)))) ||
        (pvVar14 = std::
                   vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                   ::operator[](&this->state,(long)(int)local_1c), GVar4 = ia[0],
        GVar1 != pvVar14->mask_g)) ||
       (((pvVar14 = std::
                    vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                    ::operator[](&this->state,(long)(int)local_1c), uVar2 = (uint)lia[1],
         GVar4 != (uint)pvVar14->mask_b ||
         (pvVar14 = std::
                    vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                    ::operator[](&this->state,(long)(int)local_1c), GVar1 = local_1ea,
         uVar2 != pvVar14->mask_b)) ||
        ((pvVar14 = std::
                    vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                    ::operator[](&this->state,(long)(int)local_1c), GVar4 = ia[1],
         GVar1 != pvVar14->mask_b ||
         (((pvVar14 = std::
                      vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                      ::operator[](&this->state,(long)(int)local_1c), uVar2 = (uint)lia[2],
           GVar4 != (uint)pvVar14->mask_a ||
           (pvVar14 = std::
                      vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                      ::operator[](&this->state,(long)(int)local_1c), GVar1 = local_1e9,
           uVar2 != pvVar14->mask_a)) ||
          (pvVar14 = std::
                     vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                     ::operator[](&this->state,(long)(int)local_1c), GVar1 != pvVar14->mask_a)))))))
       ) {
      tcu::TestLog::operator<<(&local_370,this->testLog,(BeginMessageToken *)&tcu::TestLog::Message)
      ;
      pMVar15 = tcu::MessageBuilder::operator<<
                          (&local_370,(char (*) [32])"GL_COLOR_WRITEMASK for buffer #");
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(int *)&local_1c);
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [19])" should be set to(");
      pvVar14 = std::
                vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                ::operator[](&this->state,(long)(int)local_1c);
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&pvVar14->mask_r);
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [3])0x2a4b1eb);
      pvVar14 = std::
                vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                ::operator[](&this->state,(long)(int)local_1c);
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&pvVar14->mask_g);
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [3])0x2a4b1eb);
      pvVar14 = std::
                vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                ::operator[](&this->state,(long)(int)local_1c);
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&pvVar14->mask_b);
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [3])0x2a4b1eb);
      pvVar14 = std::
                vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                ::operator[](&this->state,(long)(int)local_1c);
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&pvVar14->mask_a);
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [3])0x2c2d560);
      pMVar15 = tcu::MessageBuilder::operator<<
                          (pMVar15,(char (*) [35])"but the following values was set:\n");
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [6])0x2b020cb);
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(int *)(lia + 3));
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [3])0x2a4b1eb);
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(int *)((long)lia + 0x1c));
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [3])0x2a4b1eb);
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,ia);
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [3])0x2a4b1eb);
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,ia + 1);
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [2])0x2b9e07b);
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [8])"int64: ");
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(long *)&uStack_1e8);
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [3])0x2a4b1eb);
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,lia);
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [3])0x2a4b1eb);
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,lia + 1);
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [3])0x2a4b1eb);
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,lia + 2);
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [2])0x2b9e07b);
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [7])0x2b3cb18);
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&local_1ec);
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [3])0x2a4b1eb);
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&local_1eb);
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [3])0x2a4b1eb);
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&local_1ea);
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [3])0x2a4b1eb);
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&local_1e9);
      tcu::MessageBuilder::operator<<(pMVar15,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_370);
      bVar12 = false;
    }
    this_local._7_1_ = bVar12;
    if (local_1c == 0) {
      pvVar14 = std::
                vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                ::operator[](&this->state,0);
      bVar7 = CheckEnumGeneral(this,0x8009,pvVar14->mode_rgb);
      pvVar14 = std::
                vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                ::operator[](&this->state,(long)(int)local_1c);
      bVar8 = CheckEnumGeneral(this,0x883d,pvVar14->mode_a);
      pvVar14 = std::
                vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                ::operator[](&this->state,(long)(int)local_1c);
      bVar9 = CheckEnumGeneral(this,0x80c9,pvVar14->func_src_rgb);
      pvVar14 = std::
                vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                ::operator[](&this->state,(long)(int)local_1c);
      bVar10 = CheckEnumGeneral(this,0x80cb,pvVar14->func_src_a);
      pvVar14 = std::
                vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                ::operator[](&this->state,(long)(int)local_1c);
      bVar11 = CheckEnumGeneral(this,0x80c8,pvVar14->func_dst_rgb);
      pvVar14 = std::
                vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                ::operator[](&this->state,(long)(int)local_1c);
      bVar13 = CheckEnumGeneral(this,0x80ca,pvVar14->func_dst_a);
      (*this->gl->getIntegerv)(0xc23,(GLint *)(lia + 3));
      (*this->gl->getInteger64v)(0xc23,(GLint64 *)&uStack_1e8);
      (*this->gl->getBooleanv)(0xc23,&local_1ec);
      (*this->gl->getFloatv)(0xc23,&local_388);
      pvVar14 = std::
                vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                ::operator[](&this->state,(long)(int)local_1c);
      if (((((uint)lia[3] != pvVar14->mask_r) ||
           (pvVar14 = std::
                      vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                      ::operator[](&this->state,(long)(int)local_1c), uStack_1e8 != pvVar14->mask_r)
           ) || ((pvVar14 = std::
                            vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                            ::operator[](&this->state,(long)(int)local_1c),
                 lia[3]._4_4_ != pvVar14->mask_g ||
                 ((pvVar14 = std::
                             vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                             ::operator[](&this->state,(long)(int)local_1c),
                  (uint)lia[0] != pvVar14->mask_g ||
                  (pvVar14 = std::
                             vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                             ::operator[](&this->state,(long)(int)local_1c),
                  ia[0] != (uint)pvVar14->mask_b)))))) ||
         (((pvVar14 = std::
                      vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                      ::operator[](&this->state,(long)(int)local_1c),
           (uint)lia[1] != pvVar14->mask_b ||
           (((pvVar14 = std::
                        vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                        ::operator[](&this->state,(long)(int)local_1c),
             ia[1] != (uint)pvVar14->mask_a ||
             (pvVar14 = std::
                        vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                        ::operator[](&this->state,(long)(int)local_1c),
             (uint)lia[2] != pvVar14->mask_a)) ||
            (pvVar14 = std::
                       vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                       ::operator[](&this->state,(long)(int)local_1c), local_1ec != pvVar14->mask_r)
            ))) || (((((pvVar14 = std::
                                  vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                                  ::operator[](&this->state,(long)(int)local_1c),
                       (int)local_388 != (uint)pvVar14->mask_r ||
                       (pvVar14 = std::
                                  vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                                  ::operator[](&this->state,(long)(int)local_1c),
                       local_1eb != pvVar14->mask_g)) ||
                      ((pvVar14 = std::
                                  vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                                  ::operator[](&this->state,(long)(int)local_1c),
                       (int)local_384 != (uint)pvVar14->mask_g ||
                       ((pvVar14 = std::
                                   vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                                   ::operator[](&this->state,(long)(int)local_1c),
                        local_1ea != pvVar14->mask_b ||
                        (pvVar14 = std::
                                   vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                                   ::operator[](&this->state,(long)(int)local_1c),
                        (int)fa[0] != (uint)pvVar14->mask_b)))))) ||
                     (pvVar14 = std::
                                vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                                ::operator[](&this->state,(long)(int)local_1c),
                     local_1e9 != pvVar14->mask_a)) ||
                    (pvVar14 = std::
                               vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                               ::operator[](&this->state,(long)(int)local_1c),
                    this_local._7_1_ =
                         (((((bVar12 & bVar7) != 0 && bVar8) && bVar9) && bVar10) && bVar11) &&
                         bVar13, (int)fa[1] != (uint)pvVar14->mask_a)))))) {
        tcu::TestLog::operator<<
                  (&local_508,this->testLog,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar15 = tcu::MessageBuilder::operator<<
                            (&local_508,(char (*) [32])"GL_COLOR_WRITEMASK for buffer #");
        pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(int *)&local_1c);
        pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [19])" should be set to(");
        pvVar14 = std::
                  vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                  ::operator[](&this->state,(long)(int)local_1c);
        pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&pvVar14->mask_r);
        pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [3])0x2a4b1eb);
        pvVar14 = std::
                  vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                  ::operator[](&this->state,(long)(int)local_1c);
        pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&pvVar14->mask_g);
        pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [3])0x2a4b1eb);
        pvVar14 = std::
                  vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                  ::operator[](&this->state,(long)(int)local_1c);
        pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&pvVar14->mask_b);
        pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [3])0x2a4b1eb);
        pvVar14 = std::
                  vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                  ::operator[](&this->state,(long)(int)local_1c);
        pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&pvVar14->mask_a);
        pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [3])0x2c2d560);
        pMVar15 = tcu::MessageBuilder::operator<<
                            (pMVar15,(char (*) [35])"but the following values was set:\n");
        pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [6])0x2b020cb);
        pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(int *)(lia + 3));
        pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [3])0x2a4b1eb);
        pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(int *)((long)lia + 0x1c));
        pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [3])0x2a4b1eb);
        pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,ia);
        pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [3])0x2a4b1eb);
        pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,ia + 1);
        pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [2])0x2b9e07b);
        pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [8])"int64: ");
        pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(long *)&uStack_1e8);
        pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [3])0x2a4b1eb);
        pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,lia);
        pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [3])0x2a4b1eb);
        pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,lia + 1);
        pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [3])0x2a4b1eb);
        pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,lia + 2);
        pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [2])0x2b9e07b);
        pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [7])0x2b3cb18);
        pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&local_1ec);
        pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [3])0x2a4b1eb);
        pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&local_1eb);
        pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [3])0x2a4b1eb);
        pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&local_1ea);
        pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [3])0x2a4b1eb);
        pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&local_1e9);
        pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [2])0x2b9e07b);
        pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [8])"float: ");
        pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&local_388);
        pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [3])0x2a4b1eb);
        pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&local_384);
        pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [3])0x2a4b1eb);
        pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,fa);
        pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [3])0x2a4b1eb);
        pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,fa + 1);
        tcu::MessageBuilder::operator<<(pMVar15,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_508);
        this_local._7_1_ = false;
      }
    }
  }
  else {
    tcu::TestLog::operator<<(&local_1a0,this->testLog,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar15 = tcu::MessageBuilder::operator<<(&local_1a0,(char (*) [22])"Blending for buffer #");
    pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(int *)&local_1c);
    pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [10])" set to: ");
    pvVar14 = std::
              vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
              ::operator[](&this->state,(long)(int)local_1c);
    local_1ad[0] = pvVar14->enable == 0;
    pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,local_1ad);
    pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [16])0x2b31070);
    pvVar14 = std::
              vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
              ::operator[](&this->state,(long)(int)local_1c);
    pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&pvVar14->enable);
    pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [2])0x2afbe53);
    tcu::MessageBuilder::operator<<(pMVar15,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1a0);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool DrawBuffersIndexedBase::BlendMaskStateMachine::CheckBuffer(int idx)
{
	if (gl.isEnabledi(GL_BLEND, idx) != state[idx].enable)
	{
		testLog << tcu::TestLog::Message << "Blending for buffer #" << idx << " set to: " << !state[idx].enable
				<< " but should be " << state[idx].enable << "!" << tcu::TestLog::EndMessage;
		return false;
	}

	bool result = true;

	result &= CheckEnumForBuffer(idx, GL_BLEND_EQUATION_RGB, state[idx].mode_rgb);
	result &= CheckEnumForBuffer(idx, GL_BLEND_EQUATION_ALPHA, state[idx].mode_a);
	result &= CheckEnumForBuffer(idx, GL_BLEND_SRC_RGB, state[idx].func_src_rgb);
	result &= CheckEnumForBuffer(idx, GL_BLEND_SRC_ALPHA, state[idx].func_src_a);
	result &= CheckEnumForBuffer(idx, GL_BLEND_DST_RGB, state[idx].func_dst_rgb);
	result &= CheckEnumForBuffer(idx, GL_BLEND_DST_ALPHA, state[idx].func_dst_a);

	glw::GLint	 ia[4];
	glw::GLint64   lia[4];
	glw::GLboolean ba[4];

	gl.getIntegeri_v(GL_COLOR_WRITEMASK, idx, ia);
	gl.getInteger64i_v(GL_COLOR_WRITEMASK, idx, lia);
	gl.getBooleani_v(GL_COLOR_WRITEMASK, idx, ba);
	if ((ia[0] != state[idx].mask_r) || (static_cast<int>(lia[0]) != state[idx].mask_r) ||
		(static_cast<int>(ba[0]) != state[idx].mask_r) || (ia[1] != state[idx].mask_g) ||
		(static_cast<int>(lia[1]) != state[idx].mask_g) || (static_cast<int>(ba[1]) != state[idx].mask_g) ||
		(ia[2] != state[idx].mask_b) || (static_cast<int>(lia[2]) != state[idx].mask_b) ||
		(static_cast<int>(ba[2]) != state[idx].mask_b) || (ia[3] != state[idx].mask_a) ||
		(static_cast<int>(lia[3]) != state[idx].mask_a) || (static_cast<int>(ba[3]) != state[idx].mask_a))
	{
		testLog << tcu::TestLog::Message << "GL_COLOR_WRITEMASK for buffer #" << idx << " should be set to("
				<< state[idx].mask_r << ", " << state[idx].mask_g << ", " << state[idx].mask_b << ", "
				<< state[idx].mask_a << ")\n"
				<< "but the following values was set:\n"
				<< "int: " << ia[0] << ", " << ia[1] << ", " << ia[2] << ", " << ia[3] << "\n"
				<< "int64: " << lia[0] << ", " << lia[1] << ", " << lia[2] << ", " << lia[3] << "\n"
				<< "bool: " << ba[0] << ", " << ba[1] << ", " << ba[2] << ", " << ba[3] << tcu::TestLog::EndMessage;
		result = false;
	}
	if (idx == 0)
	{
		result &= CheckEnumGeneral(GL_BLEND_EQUATION_RGB, state[idx].mode_rgb);
		result &= CheckEnumGeneral(GL_BLEND_EQUATION_ALPHA, state[idx].mode_a);
		result &= CheckEnumGeneral(GL_BLEND_SRC_RGB, state[idx].func_src_rgb);
		result &= CheckEnumGeneral(GL_BLEND_SRC_ALPHA, state[idx].func_src_a);
		result &= CheckEnumGeneral(GL_BLEND_DST_RGB, state[idx].func_dst_rgb);
		result &= CheckEnumGeneral(GL_BLEND_DST_ALPHA, state[idx].func_dst_a);

		glw::GLfloat fa[4];

		gl.getIntegerv(GL_COLOR_WRITEMASK, ia);
		gl.getInteger64v(GL_COLOR_WRITEMASK, lia);
		gl.getBooleanv(GL_COLOR_WRITEMASK, ba);
		gl.getFloatv(GL_COLOR_WRITEMASK, fa);
		if ((ia[0] != state[idx].mask_r) || (static_cast<int>(lia[0]) != state[idx].mask_r) ||
			(ia[1] != state[idx].mask_g) || (static_cast<int>(lia[1]) != state[idx].mask_g) ||
			(ia[2] != state[idx].mask_b) || (static_cast<int>(lia[2]) != state[idx].mask_b) ||
			(ia[3] != state[idx].mask_a) || (static_cast<int>(lia[3]) != state[idx].mask_a) ||
			(static_cast<int>(ba[0]) != state[idx].mask_r) || (static_cast<int>(fa[0]) != state[idx].mask_r) ||
			(static_cast<int>(ba[1]) != state[idx].mask_g) || (static_cast<int>(fa[1]) != state[idx].mask_g) ||
			(static_cast<int>(ba[2]) != state[idx].mask_b) || (static_cast<int>(fa[2]) != state[idx].mask_b) ||
			(static_cast<int>(ba[3]) != state[idx].mask_a) || (static_cast<int>(fa[3]) != state[idx].mask_a))
		{
			testLog << tcu::TestLog::Message << "GL_COLOR_WRITEMASK for buffer #" << idx << " should be set to("
					<< state[idx].mask_r << ", " << state[idx].mask_g << ", " << state[idx].mask_b << ", "
					<< state[idx].mask_a << ")\n"
					<< "but the following values was set:\n"
					<< "int: " << ia[0] << ", " << ia[1] << ", " << ia[2] << ", " << ia[3] << "\n"
					<< "int64: " << lia[0] << ", " << lia[1] << ", " << lia[2] << ", " << lia[3] << "\n"
					<< "bool: " << ba[0] << ", " << ba[1] << ", " << ba[2] << ", " << ba[3] << "\n"
					<< "float: " << fa[0] << ", " << fa[1] << ", " << fa[2] << ", " << fa[3]
					<< tcu::TestLog::EndMessage;
			result = false;
		}
	}
	return result;
}